

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O3

int is_uncompressed(char *base58,uchar *bytes,size_t len,size_t *uncompressed)

{
  int iVar1;
  ulong in_RAX;
  undefined8 uVar2;
  size_t written;
  ulong local_18;
  
  local_18 = in_RAX;
  iVar1 = wally_base58_to_bytes(base58,1,bytes,0x26,&local_18);
  if ((iVar1 == 0) && (iVar1 = -2, local_18 < 0x27)) {
    if (local_18 == 0x21) {
      uVar2 = 1;
    }
    else {
      if (local_18 != 0x22) {
        return -2;
      }
      if (bytes[0x21] != '\x01') {
        return -2;
      }
      uVar2 = 0;
    }
    *(undefined8 *)len = uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int is_uncompressed(const char *base58, unsigned char *bytes, size_t len, size_t *uncompressed)
{
    int ret;
    size_t written;

    if ((ret = wally_base58_to_bytes(base58, BASE58_FLAG_CHECKSUM, bytes, len, &written)))
        return ret;

    if (written > len)
        return WALLY_EINVAL; /** Not enough space for decoded WIF string */

    if (written == EC_PRIVATE_KEY_LEN + 1) {
        *uncompressed = 1;
        return WALLY_OK;
    } else if ((written == EC_PRIVATE_KEY_LEN + 2) && bytes[EC_PRIVATE_KEY_LEN + 1] == 0x01) {
        *uncompressed = 0;
        return WALLY_OK;
    }

    return WALLY_EINVAL;
}